

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

bool __thiscall utf8stream::seek(utf8stream *this,offset off,int whence)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uchar skip [512];
  undefined1 auStack_238 [520];
  
  if ((this->writing == false) && (this->reading == true)) {
    if (whence == 1) {
      lVar3 = this->pos;
      off = off + lVar3;
    }
    else {
      if (whence == 2) {
        do {
          iVar2 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,0x200);
        } while (iVar2 == 0x200);
        return off == 0;
      }
      lVar3 = this->pos;
    }
    uVar5 = off - lVar3;
    if (off < lVar3) {
      if (off < 0) goto LAB_0015acd1;
      iVar2 = (*this->file->_vptr_stream[6])(this->file,0,0);
      if ((char)iVar2 == '\0') {
        return false;
      }
      this->pos = 0;
      this->bufread = 0;
      this->bufcarry = 0;
      this->buflen = 0;
      checkheader(this);
      uVar5 = off;
    }
    bVar7 = true;
    if (0 < (long)uVar5) {
      do {
        uVar4 = 0x200;
        if (uVar5 < 0x200) {
          uVar4 = uVar5;
        }
        iVar2 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,uVar4 & 0xffffffff);
        if (iVar2 != (int)uVar4) {
          if (this->reading == true) {
            this->reading = false;
          }
          goto LAB_0015acd1;
        }
        uVar6 = uVar5 - uVar4;
        bVar1 = (long)uVar4 <= (long)uVar5;
        uVar5 = uVar6;
      } while (uVar6 != 0 && bVar1);
    }
  }
  else {
LAB_0015acd1:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool seek(offset off, int whence)
    {
        if(writing || !reading) return false;

        if(whence == SEEK_END)
        {
            uchar skip[512];
            while(read(skip, sizeof(skip)) == sizeof(skip));
            return !off;
        }
        else if(whence == SEEK_CUR) off += pos;

        if(off >= pos) off -= pos;
        else if(off < 0 || !file->seek(0, SEEK_SET)) return false;
        else
        {
            bufread = bufcarry = buflen = 0;
            pos = 0;
            checkheader();
        }

        uchar skip[512];
        while(off > 0)
        {
            int skipped = (int)min(off, (offset)sizeof(skip));
            if(read(skip, skipped) != skipped) { stopreading(); return false; }
            off -= skipped;
        }

        return true;
    }